

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

int agentfwd_accepting(Plug *p,accept_fn_t constructor,accept_ctx_t ctx)

{
  Channel *chan_00;
  Socket *s_00;
  char *pcVar1;
  SshChannel *sc;
  char *err;
  Socket *s;
  Channel *chan;
  Plug *plug;
  agentfwd *agent;
  accept_fn_t constructor_local;
  Plug *p_local;
  accept_ctx_t ctx_local;
  
  plug = p + -2;
  agent = (agentfwd *)constructor;
  constructor_local = (accept_fn_t)p;
  p_local = (Plug *)ctx;
  chan_00 = portfwd_raw_new((ConnectionLayer *)plug->vt,(Plug **)&chan,false);
  s_00 = (Socket *)(*(code *)agent)(p_local,chan);
  pcVar1 = sk_socket_error(s_00);
  if (pcVar1 == (char *)0x0) {
    sc = ssh_serverside_agent_open((ConnectionLayer *)plug->vt,chan_00);
    portfwd_raw_setup(chan_00,s_00,sc);
  }
  else {
    portfwd_raw_free(chan_00);
  }
  ctx_local._5_3_ = 0;
  ctx_local._4_1_ = pcVar1 != (char *)0x0;
  return ctx_local._4_4_;
}

Assistant:

static int agentfwd_accepting(
    Plug *p, accept_fn_t constructor, accept_ctx_t ctx)
{
    agentfwd *agent = container_of(p, agentfwd, plug);
    Plug *plug;
    Channel *chan;
    Socket *s;
    const char *err;

    chan = portfwd_raw_new(agent->cl, &plug, false);
    s = constructor(ctx, plug);
    if ((err = sk_socket_error(s)) != NULL) {
        portfwd_raw_free(chan);
        return 1;
    }
    portfwd_raw_setup(chan, s, ssh_serverside_agent_open(agent->cl, chan));

    return 0;
}